

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool FIX::Session::sendToTarget(Message *message,string *qualifier)

{
  bool bVar1;
  SessionID sessionID;
  SessionID local_170;
  
  Message::getSessionID(&local_170,message,qualifier);
  bVar1 = sendToTarget(message,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.m_frozenString._M_dataplus._M_p != &local_170.m_frozenString.field_2) {
    operator_delete(local_170.m_frozenString._M_dataplus._M_p,
                    local_170.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.m_sessionQualifier._M_dataplus._M_p != &local_170.m_sessionQualifier.field_2) {
    operator_delete(local_170.m_sessionQualifier._M_dataplus._M_p,
                    local_170.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&local_170.m_targetCompID);
  FieldBase::~FieldBase((FieldBase *)&local_170.m_senderCompID);
  FieldBase::~FieldBase((FieldBase *)&local_170);
  return bVar1;
}

Assistant:

EXCEPT(SessionNotFound) {
  try {
    SessionID sessionID = message.getSessionID(qualifier);
    return sendToTarget(message, sessionID);
  } catch (FieldNotFound &) {
    throw SessionNotFound();
  }
}